

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O2

BCIns * lj_snap_restore(jit_State *J,void *exptr)

{
  SnapShot *pSVar1;
  TValue *o;
  IRIns *ira;
  uint *puVar2;
  byte bVar3;
  ushort uVar4;
  ushort uVar5;
  uint uVar6;
  CTypeID id;
  SnapEntry *pSVar7;
  lua_State *L;
  IRIns *pIVar8;
  IRIns *pIVar9;
  IRIns *pIVar10;
  CTInfo info;
  uint uVar11;
  undefined4 uVar12;
  BloomFilter rfilt;
  ulong uVar13;
  GCcdata *pGVar14;
  GCtab *t;
  byte *pbVar15;
  byte bVar16;
  SnapShot *pSVar17;
  ulong uVar18;
  IRIns *ir;
  jit_State *J_00;
  ExitState *ex;
  IRRef2 IVar19;
  ulong uVar20;
  uint ref;
  IRIns *pIVar21;
  uint32_t uVar22;
  CTState *cts;
  TValue *in_stack_ffffffffffffff38;
  SnapEntry *pSVar23;
  CTSize sz;
  lua_State *local_70;
  TValue *local_68;
  long local_60;
  uint32_t local_54;
  SnapShot *local_50;
  uint32_t *local_48;
  TValue local_40;
  BCIns *local_38;
  
  uVar6 = J->exitno;
  ex = (ExitState *)(ulong)uVar6;
  J_00 = (jit_State *)(ulong)J->trace[J->parent].gcptr32;
  local_60 = (long)ex * 0xc;
  local_50 = (J_00->cur).snap;
  pSVar7 = (J_00->cur).snapmap;
  pSVar1 = local_50 + (long)ex;
  bVar3 = pSVar1->nent;
  pSVar23 = pSVar7 + pSVar1->mapofs;
  pSVar17 = (SnapShot *)&(J_00->cur).nsnapmap;
  if (pSVar1 + 1 != local_50 + (J_00->cur).nsnap) {
    pSVar17 = pSVar1 + 1;
  }
  uVar22 = pSVar17->mapofs;
  rfilt = snap_renamefilter((GCtrace *)J_00,uVar6);
  local_38 = (BCIns *)(ulong)pSVar23[bVar3];
  L = J->L;
  *(SnapEntry *)(((ulong)L->cframe & 0xfffffffffffffffc) + 0x1c) = pSVar23[bVar3] + 4;
  local_68 = L->base;
  bVar16 = pSVar1->topslot;
  local_70 = L;
  if ((TValue *)(ulong)(L->maxstack).ptr32 <= local_68 + bVar16) {
    L->top = local_68 + *(byte *)((ulong)*(uint *)((ulong)local_68[-1].u32.lo + 0x10) - 0x39);
    lj_state_growstack(L,(uint)bVar16 -
                         (uint)*(byte *)((ulong)*(uint *)((ulong)local_68[-1].u32.lo + 0x10) - 0x39)
                      );
    local_68 = L->base;
  }
  local_50 = (SnapShot *)((long)&local_50->mapofs + local_60);
  local_48 = pSVar7 + (uVar22 - 1);
  local_54 = *(uint32_t *)((long)local_68 + -4);
  local_68 = local_68 + -1;
  uVar20 = 0;
  do {
    if (uVar20 == bVar3) {
      uVar11 = (byte)*local_38 - 0x3f;
      uVar6 = uVar11 >> 1;
      if ((((uVar6 | (uint)((uVar11 & 1) != 0) << 0x1f) < 6) && ((0x27U >> (uVar6 & 0x1f) & 1) != 0)
          ) || (0x58 < (byte)*local_38)) {
        pbVar15 = (byte *)((long)local_50 + 8);
      }
      else {
        local_68 = local_70->base;
        pbVar15 = (byte *)((ulong)*(uint *)((ulong)local_68[-1].u32.lo + 0x10) - 0x39);
      }
      local_70->top = local_68 + *pbVar15;
      J->nsnaprestore = J->nsnaprestore + 1;
      return local_38;
    }
    uVar11 = pSVar23[uVar20];
    if ((uVar11 >> 0x12 & 1) == 0) {
      o = local_68 + (uVar11 >> 0x18);
      ref = uVar11 & 0xffff;
      uVar18 = (ulong)ref;
      pIVar21 = (J_00->cur).ir;
      if (*(char *)((long)pIVar21 + uVar18 * 8 + 6) == -3) {
        ira = pIVar21 + uVar18;
        uVar13 = 0;
        do {
          if (uVar20 == uVar13) {
            if ((ira->field_1).o - 0x51 < 2) {
              cts = (CTState *)(ulong)*(uint *)((ulong)(J->L->glref).ptr32 + 0x194);
              cts->L = J->L;
              id = pIVar21[(ira->field_0).op1].field_1.op12;
              info = lj_ctype_info(cts,id,&sz);
              pGVar14 = lj_cdata_newx(cts,id,sz,info);
              uVar22 = (uint32_t)pGVar14;
              (o->u32).lo = uVar22;
              (o->field_2).it = 0xfffffff5;
              if ((ira->field_1).o == 'R') {
                in_stack_ffffffffffffff38 =
                     (TValue *)CONCAT44((int)((ulong)in_stack_ffffffffffffff38 >> 0x20),sz);
                snap_restoredata(J_00,(GCtrace *)exptr,ex,(SnapNo)rfilt,(ulong)(ira->field_0).op2,
                                 uVar22 + 8,in_stack_ffffffffffffff38,(CTSize)pSVar23);
              }
              else {
                uVar4 = *(ushort *)((long)&((J_00->cur).snap)->ref + local_60);
                pIVar8 = (J_00->cur).ir;
                pIVar21 = pIVar21 + uVar18;
                while (pIVar10 = pIVar21, pIVar21 = pIVar10 + 1, pIVar21 < pIVar8 + uVar4) {
                  if (*(char *)((long)pIVar10 + 0xe) == -2) {
                    if ((ulong)*(byte *)((long)pIVar10 + 0xf) == 0xff) {
                      uVar11 = snap_sunk_store2((GCtrace *)J_00,ira,pIVar21);
                    }
                    else {
                      uVar11 = (uint)(pIVar21 == ira + *(byte *)((long)pIVar10 + 0xf));
                    }
                    if (uVar11 != 0) {
                      uVar12 = 8;
                      if ((0x604208U >> (*(uint *)((long)pIVar10 + 0xc) & 0x1f) & 1) == 0) {
                        bVar16 = ((byte)*(uint *)((long)pIVar10 + 0xc) & 0x1f) - 0xf;
                        uVar12 = 4;
                        if (bVar16 < 4) {
                          uVar12 = *(undefined4 *)(&DAT_0015ad3c + (ulong)bVar16 * 4);
                        }
                      }
                      pIVar9 = (J_00->cur).ir;
                      uVar18 = (ulong)*(ushort *)
                                       ((long)pIVar9 + (ulong)(pIVar21->field_0).op1 * 8 + 2);
                      if (*(char *)((long)pIVar9 + uVar18 * 8 + 5) == '\x1d') {
                        IVar19 = pIVar9[uVar18 + 1].i;
                      }
                      else {
                        IVar19 = pIVar9[uVar18].field_1.op12;
                      }
                      in_stack_ffffffffffffff38 =
                           (TValue *)
                           CONCAT44((int)((ulong)in_stack_ffffffffffffff38 >> 0x20),uVar12);
                      snap_restoredata(J_00,(GCtrace *)exptr,ex,(SnapNo)rfilt,
                                       (ulong)*(ushort *)((long)pIVar10 + 10),IVar19 + uVar22,
                                       in_stack_ffffffffffffff38,(CTSize)pSVar23);
                    }
                  }
                }
              }
            }
            else {
              if ((ira->field_1).o == 0x4f) {
                t = lj_tab_new(J->L,(uint)(ira->field_0).op1,(uint)(ira->field_0).op2);
              }
              else {
                t = lj_tab_dup(J->L,(GCtab *)(ulong)pIVar21[(ira->field_0).op1].field_1.op12);
              }
              (o->u32).lo = (uint32_t)t;
              (o->field_2).it = 0xfffffff4;
              uVar4 = *(ushort *)((long)&((J_00->cur).snap)->ref + local_60);
              pIVar8 = (J_00->cur).ir;
              pIVar21 = pIVar21 + uVar18;
              while (pIVar10 = pIVar21, pIVar21 = pIVar10 + 1, pIVar21 < pIVar8 + uVar4) {
                if (*(char *)((long)pIVar10 + 0xe) == -2) {
                  if ((ulong)*(byte *)((long)pIVar10 + 0xf) == 0xff) {
                    uVar11 = snap_sunk_store2((GCtrace *)J_00,ira,pIVar21);
                  }
                  else {
                    uVar11 = (uint)(pIVar21 == ira + *(byte *)((long)pIVar10 + 0xf));
                  }
                  if (uVar11 != 0) {
                    pIVar9 = (J_00->cur).ir;
                    uVar5 = *(ushort *)((long)pIVar9 + (ulong)(pIVar21->field_0).op1 * 8 + 2);
                    if (*(char *)((long)pIVar9 + (ulong)(pIVar21->field_0).op1 * 8 + 5) == '>') {
                      if (uVar5 == 5) {
                        if (*(char *)((long)pIVar9 + (ulong)*(ushort *)((long)pIVar10 + 10) * 8 + 5)
                            == '\x1b') {
                          (t->metatable).gcptr32 = 0;
                        }
                        else {
                          in_stack_ffffffffffffff38 = &local_40;
                          snap_restoreval(J,(GCtrace *)J_00,(ExitState *)exptr,uVar6,rfilt,
                                          (uint)*(ushort *)((long)pIVar10 + 10),
                                          in_stack_ffffffffffffff38);
                          (t->metatable).gcptr32 = (uint32_t)local_40.field_2.field_0;
                        }
                      }
                    }
                    else {
                      ir = pIVar9 + uVar5;
                      if ((ir->field_1).o == '\x1e') {
                        ir = pIVar9 + (ir->field_0).op1;
                      }
                      lj_ir_kvalue(J->L,&local_40,ir);
                      in_stack_ffffffffffffff38 = lj_tab_set(J->L,t,&local_40);
                      snap_restoreval(J,(GCtrace *)J_00,(ExitState *)exptr,uVar6,rfilt,
                                      (uint)*(ushort *)((long)pIVar10 + 10),
                                      in_stack_ffffffffffffff38);
                    }
                  }
                }
              }
            }
            goto LAB_00141744;
          }
          puVar2 = pSVar23 + uVar13;
          uVar13 = uVar13 + 1;
        } while ((*puVar2 & 0xffff) != ref);
        *o = local_68[*puVar2 >> 0x18];
      }
      else {
        in_stack_ffffffffffffff38 = o;
        snap_restoreval(J,(GCtrace *)J_00,(ExitState *)exptr,uVar6,rfilt,ref,o);
        if ((uVar11 & 0x30000) != 0) {
          uVar22 = local_54;
          if (0xffffff < uVar11) {
            uVar22 = *local_48;
            local_48 = local_48 + -1;
          }
          (o->field_2).it = uVar22;
          local_70->base = o + 1;
        }
      }
    }
LAB_00141744:
    uVar20 = uVar20 + 1;
  } while( true );
}

Assistant:

const BCIns *lj_snap_restore(jit_State *J, void *exptr)
{
  ExitState *ex = (ExitState *)exptr;
  SnapNo snapno = J->exitno;  /* For now, snapno == exitno. */
  GCtrace *T = traceref(J, J->parent);
  SnapShot *snap = &T->snap[snapno];
  MSize n, nent = snap->nent;
  SnapEntry *map = &T->snapmap[snap->mapofs];
#if !LJ_FR2 || defined(LUA_USE_ASSERT)
  SnapEntry *flinks = &T->snapmap[snap_nextofs(T, snap)-1-LJ_FR2];
#endif
#if !LJ_FR2
  ptrdiff_t ftsz0;
#endif
  TValue *frame;
  BloomFilter rfilt = snap_renamefilter(T, snapno);
  const BCIns *pc = snap_pc(&map[nent]);
  lua_State *L = J->L;

  /* Set interpreter PC to the next PC to get correct error messages. */
  setcframe_pc(cframe_raw(L->cframe), pc+1);

  /* Make sure the stack is big enough for the slots from the snapshot. */
  if (LJ_UNLIKELY(L->base + snap->topslot >= tvref(L->maxstack))) {
    L->top = curr_topL(L);
    lj_state_growstack(L, snap->topslot - curr_proto(L)->framesize);
  }

  /* Fill stack slots with data from the registers and spill slots. */
  frame = L->base-1-LJ_FR2;
#if !LJ_FR2
  ftsz0 = frame_ftsz(frame);  /* Preserve link to previous frame in slot #0. */
#endif
  for (n = 0; n < nent; n++) {
    SnapEntry sn = map[n];
    if (!(sn & SNAP_NORESTORE)) {
      TValue *o = &frame[snap_slot(sn)];
      IRRef ref = snap_ref(sn);
      IRIns *ir = &T->ir[ref];
      if (ir->r == RID_SUNK) {
	MSize j;
	for (j = 0; j < n; j++)
	  if (snap_ref(map[j]) == ref) {  /* De-duplicate sunk allocations. */
	    copyTV(L, o, &frame[snap_slot(map[j])]);
	    goto dupslot;
	  }
	snap_unsink(J, T, ex, snapno, rfilt, ir, o);
      dupslot:
	continue;
      }
      snap_restoreval(J, T, ex, snapno, rfilt, ref, o);
      if (LJ_SOFTFP32 && (sn & SNAP_SOFTFPNUM) && tvisint(o)) {
	TValue tmp;
	snap_restoreval(J, T, ex, snapno, rfilt, ref+1, &tmp);
	o->u32.hi = tmp.u32.lo;
#if !LJ_FR2
      } else if ((sn & (SNAP_CONT|SNAP_FRAME))) {
	/* Overwrite tag with frame link. */
	setframe_ftsz(o, snap_slot(sn) != 0 ? (int32_t)*flinks-- : ftsz0);
	L->base = o+1;
#endif
      }
    }
  }
#if LJ_FR2
  L->base += (map[nent+LJ_BE] & 0xff);
#endif
  lj_assertJ(map + nent == flinks, "inconsistent frames in snapshot");

  /* Compute current stack top. */
  switch (bc_op(*pc)) {
  default:
    if (bc_op(*pc) < BC_FUNCF) {
      L->top = curr_topL(L);
      break;
    }
    /* fallthrough */
  case BC_CALLM: case BC_CALLMT: case BC_RETM: case BC_TSETM:
    L->top = frame + snap->nslots;
    break;
  }
  J->nsnaprestore++;
  return pc;
}